

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayBufferCase::createTexture
          (TexSubImageCubeArrayBufferCase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int rowPitch_00;
  deUint32 format;
  deUint32 type;
  deInt32 rowPitch_01;
  reference pvVar4;
  size_type sVar5;
  int local_1a4;
  int local_1a0;
  PixelBufferAccess local_150;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  undefined1 local_108 [8];
  Vec4 colorB;
  Vector<float,_4> local_e8;
  undefined1 local_d8 [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  int slicePitch_1;
  int imageHeight;
  int rowPitch_1;
  int rowLength;
  int local_6c;
  int local_68;
  int slicePitch;
  int rowPitch;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 local_38;
  deUint32 buf;
  deUint32 tex;
  int pixelSize;
  TransferFormat local_28;
  TransferFormat transferFmt;
  TexSubImageCubeArrayBufferCase *this_local;
  
  _tex = (this->super_TextureCubeArraySpecCase).m_texFormat;
  transferFmt = (TransferFormat)this;
  local_28 = glu::getTransferFormat(_tex);
  buf = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeArraySpecCase).m_texFormat);
  local_38 = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             &local_38);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,local_38);
  local_68 = deAlign32(buf * (this->super_TextureCubeArraySpecCase).m_size,4);
  local_6c = local_68 * (this->super_TextureCubeArraySpecCase).m_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
             (long)(local_6c * (this->super_TextureCubeArraySpecCase).m_depth));
  rowPitch_00 = local_68;
  iVar3 = local_6c;
  iVar1 = (this->super_TextureCubeArraySpecCase).m_size;
  iVar2 = (this->super_TextureCubeArraySpecCase).m_depth;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&rowPitch_1,&(this->super_TextureCubeArraySpecCase).m_texFormat,
             iVar1,iVar1,iVar2,rowPitch_00,iVar3,pvVar4);
  tcu::fillWithComponentGradients
            ((PixelBufferAccess *)&rowPitch_1,
             &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin,
             &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax);
  iVar1 = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
  iVar2 = (this->super_TextureCubeArraySpecCase).m_size;
  iVar3 = (this->super_TextureCubeArraySpecCase).m_depth;
  format = local_28.format;
  type = local_28.dataType;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,0,iVar1,iVar2,iVar2,iVar3,0,format,type,pvVar4);
  if (this->m_rowLength < 1) {
    local_1a0 = this->m_subW;
  }
  else {
    local_1a0 = this->m_rowLength;
  }
  rowPitch_01 = deAlign32(local_1a0 * buf,this->m_alignment);
  if (this->m_imageHeight < 1) {
    local_1a4 = this->m_subH;
  }
  else {
    local_1a4 = this->m_imageHeight;
  }
  local_1a4 = local_1a4 * rowPitch_01;
  tcu::operator-((tcu *)(cBias.m_data + 2),
                 &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax,
                 &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_e8,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_d8,&local_e8,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_128,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_118,&local_128,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_108,&local_118,(Vector<float,_4> *)(colorA.m_data + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
             (long)(local_1a4 *
                    ((this->super_TextureCubeArraySpecCase).m_depth + this->m_skipImages) +
                   this->m_offset));
  iVar1 = this->m_subW;
  iVar2 = this->m_subH;
  iVar3 = this->m_subD;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_150,&(this->super_TextureCubeArraySpecCase).m_texFormat,iVar1,iVar2,iVar3,
             rowPitch_01,local_1a4,
             pvVar4 + (long)this->m_offset +
                      (long)(int)(this->m_skipPixels * buf) +
                      (long)(this->m_skipRows * rowPitch_01) +
                      (long)(this->m_skipImages * local_1a4));
  tcu::fillWithGrid(&local_150,4,(Vec4 *)local_d8,(Vec4 *)local_108);
  sglr::ContextWrapper::glGenBuffers
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindBuffer
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x88ec,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  sglr::ContextWrapper::glBufferData
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x88ec,(long)(int)sVar5,pvVar4,0x88e4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage3D
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,0,this->m_subX,this->m_subY,this->m_subZ,this->m_subW,this->m_subH,this->m_subD,
             local_28.format,local_28.dataType,(void *)(long)this->m_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);

		// Fill with gradient.
		{
			int		rowPitch		= deAlign32(pixelSize*m_size,  4);
			int		slicePitch		= rowPitch*m_size;

			data.resize(slicePitch*m_depth);
			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, m_depth, rowPitch, slicePitch, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		}

		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_internalFormat, m_size, m_size, m_depth, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength		= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
			int		imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_subH;
			int		slicePitch		= imageHeight*rowPitch;
			Vec4	cScale			= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias			= m_texFormatInfo.valueMin;
			Vec4	colorA			= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB			= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(slicePitch*(m_depth+m_skipImages) + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, m_subD, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_subX, m_subY, m_subZ, m_subW, m_subH, m_subD, transferFmt.format, transferFmt.dataType, (const void*)(deIntptr)m_offset);
	}